

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

void Abc_FlowRetime_ConstrainExactAll(Abc_Ntk_t *pNtk)

{
  Flow_Data_t *pFVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  void **__ptr;
  void *pArray;
  Abc_Obj_t *pObj;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  for (pObj._4_4_ = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), pObj._4_4_ < iVar3;
      pObj._4_4_ = pObj._4_4_ + 1) {
    pAVar5 = Abc_NtkObj(pNtk,pObj._4_4_);
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      pVVar2 = pManMR->vTimeEdges;
      uVar4 = Abc_ObjId(pAVar5);
      iVar3 = Vec_PtrSize(pVVar2 + uVar4);
      if (iVar3 != 0) {
        pVVar2 = pManMR->vTimeEdges;
        uVar4 = Abc_ObjId(pAVar5);
        __ptr = Vec_PtrReleaseArray(pVVar2 + uVar4);
        if (__ptr != (void **)0x0) {
          free(__ptr);
        }
      }
    }
  }
  pManMR->nExactConstraints = 0;
  for (pObj._4_4_ = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), pObj._4_4_ < iVar3;
      pObj._4_4_ = pObj._4_4_ + 1) {
    pAVar5 = Abc_NtkObj(pNtk,pObj._4_4_);
    if ((((pAVar5 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsLatch(pAVar5), iVar3 == 0)) &&
        (pFVar1 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
        (undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x80) !=
        (undefined1  [24])0x0)) &&
       (pFVar1 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
       (undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x10) ==
       (undefined1  [24])0x0)) {
      pVVar2 = pManMR->vTimeEdges;
      uVar4 = Abc_ObjId(pAVar5);
      iVar3 = Vec_PtrSize(pVVar2 + uVar4);
      if (iVar3 == 0) {
        Abc_FlowRetime_ConstrainExact(pAVar5);
      }
    }
  }
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExactAll( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj;
  void *pArray;
  
  // free existing constraints
  Abc_NtkForEachObj( pNtk, pObj, i )    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  pManMR->nExactConstraints = 0;
  
  // generate all constraints
  Abc_NtkForEachObj(pNtk, pObj, i)
    if (!Abc_ObjIsLatch(pObj) && FTEST( pObj, CONSERVATIVE ) && !FTEST( pObj, BLOCK ))
      if (!Vec_PtrSize( FTIMEEDGES( pObj ) ))
        Abc_FlowRetime_ConstrainExact( pObj );
}